

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FluctuatingChargeObjectiveFunction.cpp
# Opt level: O3

void __thiscall
OpenMD::FluctuatingChargeObjectiveFunction::setCoor
          (FluctuatingChargeObjectiveFunction *this,
          DynamicVector<double,_std::allocator<double>_> *x)

{
  pointer ppAVar1;
  Molecule *pMVar2;
  pointer ppAVar3;
  pointer pdVar4;
  Atom *pAVar5;
  int iVar6;
  MoleculeIterator i;
  MoleculeIterator local_28;
  
  local_28._M_node = (_Base_ptr)0x0;
  (*this->info_->sman_->_vptr_SnapshotManager[2])();
  pMVar2 = SimInfo::beginMolecule(this->info_,&local_28);
  if (pMVar2 != (Molecule *)0x0) {
    iVar6 = 0;
    do {
      ppAVar3 = (pMVar2->fluctuatingCharges_).
                super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
                super__Vector_impl_data._M_start;
      ppAVar1 = (pMVar2->fluctuatingCharges_).
                super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
      if ((ppAVar3 != ppAVar1) && (pAVar5 = *ppAVar3, pAVar5 != (Atom *)0x0)) {
        pdVar4 = (x->data_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start + iVar6;
        do {
          iVar6 = iVar6 + 1;
          ppAVar3 = ppAVar3 + 1;
          *(double *)
           (*(long *)((long)&(((pAVar5->super_StuntDouble).snapshotMan_)->currentSnapshot_->atomData
                             ).flucQPos.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_start + (pAVar5->super_StuntDouble).storage_
                     ) + (long)(pAVar5->super_StuntDouble).localIndex_ * 8) = *pdVar4;
          if (ppAVar3 == ppAVar1) break;
          pAVar5 = *ppAVar3;
          pdVar4 = pdVar4 + 1;
        } while (pAVar5 != (Atom *)0x0);
      }
      pMVar2 = SimInfo::nextMolecule(this->info_,&local_28);
    } while (pMVar2 != (Molecule *)0x0);
  }
  return;
}

Assistant:

void FluctuatingChargeObjectiveFunction::setCoor(
      const DynamicVector<RealType>& x) const {
    SimInfo::MoleculeIterator i;
    Molecule::FluctuatingChargeIterator j;
    Molecule* mol;
    Atom* atom;

    info_->getSnapshotManager()->advance();

    int index;
#ifdef IS_MPI
    index = displacements_[myrank_];
#else
    index = 0;
#endif

    for (mol = info_->beginMolecule(i); mol != NULL;
         mol = info_->nextMolecule(i)) {
      for (atom = mol->beginFluctuatingCharge(j); atom != NULL;
           atom = mol->nextFluctuatingCharge(j)) {
        atom->setFlucQPos(x[index++]);
      }
    }
  }